

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O3

ConversionResult
convertUTF::ConvertUTF8toUTF16
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF16 **targetStart,UTF16 *targetEnd,
          ConversionFlags flags)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  Boolean BVar4;
  ConversionResult CVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ushort *puVar10;
  byte *source;
  
  source = *sourceStart;
  puVar10 = *targetStart;
  do {
    if (sourceEnd <= source) {
      CVar5 = conversionOK;
LAB_001820b8:
      *sourceStart = source;
      *targetStart = puVar10;
      return CVar5;
    }
    bVar2 = *source;
    uVar7 = (uint)bVar2;
    bVar3 = trailingBytesForUTF8[bVar2];
    uVar9 = (ulong)bVar3;
    if (sourceEnd <= source + uVar9) {
      CVar5 = sourceExhausted;
      goto LAB_001820b8;
    }
    lVar1 = uVar9 + 1;
    BVar4 = anon_unknown_11::isLegalUTF8(source,(int)lVar1);
    CVar5 = sourceIllegal;
    if (!BVar4) goto LAB_001820b8;
    iVar6 = 0;
    switch(uVar9) {
    case 0:
      uVar8 = (uint)bVar3;
      break;
    case 5:
      iVar6 = (uint)bVar2 << 6;
      uVar7 = (uint)source[1];
      source = source + 1;
    case 4:
      iVar6 = (uVar7 + iVar6) * 0x40;
      uVar7 = (uint)source[1];
      source = source + 1;
    case 3:
      iVar6 = (uVar7 + iVar6) * 0x40;
      uVar7 = (uint)source[1];
      source = source + 1;
    case 2:
      iVar6 = (uVar7 + iVar6) * 0x40;
      uVar7 = (uint)source[1];
      source = source + 1;
    case 1:
      uVar8 = (uVar7 + iVar6) * 0x40;
      uVar7 = (uint)source[1];
      source = source + 1;
      break;
    default:
      goto switchD_00181fcb_default;
    }
    source = source + 1;
    iVar6 = uVar7 + uVar8;
switchD_00181fcb_default:
    if (targetEnd <= puVar10) {
LAB_001820e1:
      source = source + -lVar1;
      CVar5 = targetExhausted;
      goto LAB_001820b8;
    }
    uVar7 = iVar6 - *(int *)(offsetsFromUTF8 + uVar9 * 4);
    if (uVar7 < 0x10000) {
      if ((uVar7 & 0xf800) == 0xd800) {
LAB_00182068:
        if (flags == strictConversion) {
          source = source + -lVar1;
          goto LAB_001820b8;
        }
        *puVar10 = 0xfffd;
      }
      else {
        *puVar10 = (ushort)uVar7;
      }
      puVar10 = puVar10 + 1;
    }
    else {
      if (0x10ffff < uVar7) goto LAB_00182068;
      if (targetEnd <= puVar10 + 1) goto LAB_001820e1;
      *puVar10 = (short)(uVar7 + 0x3ff0000 >> 10) + 0xd800;
      puVar10[1] = (ushort)uVar7 & 0x3ff | 0xdc00;
      puVar10 = puVar10 + 2;
    }
  } while( true );
}

Assistant:

ConversionResult ConvertUTF8toUTF16(const UTF8** sourceStart, const UTF8* sourceEnd, UTF16** targetStart,
                                    const UTF16* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF8* source = *sourceStart;
    UTF16* target = *targetStart;
    while (source < sourceEnd)
    {
        UTF32 ch = 0;
        const uint8_t extraBytesToRead = trailingBytesForUTF8[*source];
        if (source + extraBytesToRead >= sourceEnd)
        {
            result = ConversionResult::sourceExhausted;
            break;
        }
        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead + 1))
        {
            result = ConversionResult::sourceIllegal;
            break;
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead)
        {
        case 5:
            ch += *source++;
            ch <<= 6; /* remember, illegal UTF-8 */
            [[fallthrough]];
        case 4:
            ch += *source++;
            ch <<= 6; /* remember, illegal UTF-8 */
            [[fallthrough]];
        case 3:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 2:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 1:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 0:
            ch += *source++;
            break;
        default:;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (target >= targetEnd)
        {
            source -= (extraBytesToRead + 1); /* Back up source pointer! */
            result = ConversionResult::targetExhausted;
            break;
        }
        if (ch <= UNI_MAX_BMP)
        { /* Target is a character <= 0xFFFF */
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END)
            {
                if (flags == ConversionFlags::strictConversion)
                {
                    source -= (extraBytesToRead + 1); /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
                *target++ = UNI_REPLACEMENT_CHAR;
            }
            else
            {
                *target++ = static_cast<UTF16>(ch); /* normal case */
            }
        }
        else if (ch > UNI_MAX_UTF16)
        {
            if (flags == ConversionFlags::strictConversion)
            {
                result = ConversionResult::sourceIllegal;
                source -= extraBytesToRead + 1; /* return to the start */
                break;                          /* Bail out; shouldn't continue */
            }
            *target++ = UNI_REPLACEMENT_CHAR;
        }
        else
        {
            /* target is a character in range 0xFFFF - 0x10FFFF. */
            if (target + 1 >= targetEnd)
            {
                source -= (extraBytesToRead + 1); /* Back up source pointer! */
                result = ConversionResult::targetExhausted;
                break;
            }
            ch -= halfBase;
            *target++ = static_cast<UTF16>((ch >> halfShift) + UNI_SUR_HIGH_START);
            *target++ = static_cast<UTF16>((ch & halfMask) + UNI_SUR_LOW_START);
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}